

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O3

void __thiscall Database<Protein>::Database(Database<Protein> *this,size_t kmerLength)

{
  size_t sVar1;
  
  this->mKmerLength = kmerLength;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->mSequences).super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::_M_initialize_map
            (&(this->mSequences).
              super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,0);
  sVar1 = this->mKmerLength;
  this->mMaxUniqueKmers = (ulong)(uint)(1 << ((char)sVar1 * '\x04' & 0x1fU));
  memset(&this->mSequenceIdsOffsetByKmer,0,0xa0);
  (this->mProgressCallback)._M_invoker =
       std::
       _Function_handler<void_(Database<Protein>::ProgressType,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database.h:63:26)>
       ::_M_invoke;
  (this->mProgressCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(Database<Protein>::ProgressType,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database.h:63:26)>
       ::_M_manager;
  if (sVar1 << 2 < 0x21) {
    return;
  }
  __assert_fail("BitMapPolicy< A >::NumBits * mKmerLength <= sizeof( Kmer ) * 8",
                "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database.h"
                ,0x42,"Database<Protein>::Database(const size_t) [Alphabet = Protein]");
}

Assistant:

Database< A >::Database( const size_t kmerLength )
    : mKmerLength( kmerLength ),
      mProgressCallback( []( ProgressType, const size_t, const size_t ) {} ),
      mMaxUniqueKmers( 1 << ( BitMapPolicy< A >::NumBits * mKmerLength ) )
{
  assert( BitMapPolicy< A >::NumBits * mKmerLength <= sizeof( Kmer ) * 8 );
}